

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void expandFormatArguments<String>(vector<String,_std::allocator<String>_> *data,String *arg)

{
  String *__x;
  FormatArgument local_38;
  String *local_18;
  String *arg_local;
  vector<String,_std::allocator<String>_> *data_local;
  
  local_18 = arg;
  arg_local = (String *)data;
  FormatArgument::FormatArgument<String>(&local_38,arg);
  __x = FormatArgument::text(&local_38);
  std::vector<String,_std::allocator<String>_>::push_back(data,__x);
  FormatArgument::~FormatArgument(&local_38);
  expandFormatArguments((vector<String,_std::allocator<String>_> *)arg_local);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}